

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::dumpProgramOptionsScript(CLIntercept *this,cl_program program,char *options)

{
  return;
}

Assistant:

void CLIntercept::dumpProgramOptionsScript(
    const cl_program program,
    const char* options )
{
#if defined(_WIN32)

    std::lock_guard<std::mutex> lock(m_Mutex);

    CLI_ASSERT( config().DumpProgramSource || config().SimpleDumpProgramSource );

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    if( options )
    {
        char    dirName[MAX_PATH] = "";
        char    fileName[MAX_PATH] = "";
        char    filePath[MAX_PATH] = "";

        if( config().DumpProgramSourceScript )
        {
            size_t  remaining = MAX_PATH;

            char    date[9] = "";
            char    time[9] = "";
            char*   curPos = NULL;
            char*   nextToken = NULL;
            char*   pch = NULL;

            // Directory:

            curPos = dirName;
            remaining = MAX_PATH;
            memset( curPos, 0, MAX_PATH );

            _strdate_s( date, 9 );
            _strtime_s( time, 9 );

            memcpy_s( curPos, remaining, "CLShaderDump_", 14 );
            curPos += 13;
            remaining -= 13;

            memcpy_s( curPos, remaining, strtok_s( date, "/", &nextToken ), 2 );
            curPos += 2;
            remaining -= 2;

            memcpy_s( curPos, remaining, strtok_s( NULL, "/", &nextToken ), 2 );
            curPos += 2;
            remaining -= 2;

            memcpy_s( curPos, remaining, strtok_s( NULL, "/", &nextToken ), 2 );
            curPos += 2;
            remaining -= 2;

            ::CreateDirectoryA( dirName, NULL );

            // File:

            curPos = fileName;
            remaining = MAX_PATH;
            memset( curPos, 0, MAX_PATH );

            if( GetModuleFileNameA( NULL, fileName, MAX_PATH-1 ) == 0 )
            {
                CLI_ASSERT( 0 );
                strcpy_s( curPos, remaining, "process.exe" );
            }

            pch = strrchr( fileName, '\\' );
            pch++;
            memcpy_s( curPos, remaining, pch, strlen( pch ) );
            curPos += strlen( pch ) - 4;    // -4 to cut off ".exe"
            remaining -= strlen( pch ) - 4;

            memcpy_s( curPos, remaining, "_", 2 );
            curPos += 1;
            remaining -= 1;

            memcpy_s( curPos, remaining, strtok_s( time, ":", &nextToken ), 2 );
            curPos += 2;
            remaining -= 2;

            memcpy_s( curPos, remaining, strtok_s( NULL, ":", &nextToken ), 2 );
            curPos += 2;
            remaining -= 2;

            memcpy_s( curPos, remaining, strtok_s( NULL, ":", &nextToken ), 2 );
            curPos += 2;
            remaining -= 2;

            CLI_SPRINTF( curPos, remaining, "_%8.8x", programInfo.ProgramNumber );
            curPos += 9;
            remaining -= 9;
        }
        else
        {
            CLI_SPRINTF( dirName, MAX_PATH, "." );
            CLI_SPRINTF( fileName, MAX_PATH, "kernel" );
        }

        CLI_SPRINTF( filePath, MAX_PATH, "%s/%s.%s", dirName, fileName, "txt" );

        dumpMemoryToFile(
            filePath,
            false,
            options,
            strlen(options) );
    }

#else
    CLI_ASSERT( 0 );
#endif
}